

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point-to-point.hpp
# Opt level: O3

status * diy::mpi::detail::recv<char>
                   (status *__return_storage_ptr__,DIY_MPI_Comm comm,int source,int tag,
                   vector<char,_std::allocator<char>_> *x)

{
  pointer pcVar1;
  pointer pcVar2;
  int iVar3;
  int c;
  status s;
  int local_4c;
  undefined1 local_48 [24];
  
  MPI_Probe(source,tag,comm.data,local_48);
  MPI_Get_count(local_48,&ompi_mpi_byte,&local_4c);
  std::vector<char,_std::allocator<char>_>::resize(x,(long)local_4c);
  pcVar1 = (x->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pcVar2 = (x->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  iVar3 = 0;
  if (pcVar1 != pcVar2) {
    iVar3 = (int)pcVar2 - (int)pcVar1;
  }
  MPI_Recv(pcVar1,iVar3,&ompi_mpi_byte,source,tag,comm.data,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

status recv(DIY_MPI_Comm comm, int source, int tag, std::vector<T>& x)
  {
    auto s = probe(comm, source, tag);
    x.resize(static_cast<size_t>(s.count<T>()));
    return recv(comm, source, tag, address(x), count(x), datatype_of(x));
  }